

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

int scale_expansion(int elen,double *e,double b,double *h)

{
  double dVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  dVar1 = splitter;
  dVar6 = splitter * b - (splitter * b - b);
  dVar7 = b - dVar6;
  dVar5 = *e;
  dVar4 = dVar5 * b;
  dVar8 = splitter * dVar5 - (splitter * dVar5 - dVar5);
  *h = (dVar5 - dVar8) * dVar7 -
       (((dVar4 - dVar8 * dVar6) - (dVar5 - dVar8) * dVar6) - dVar8 * dVar7);
  lVar3 = 1;
  if (1 < elen) {
    lVar2 = 0;
    dVar5 = dVar4;
    do {
      lVar3 = lVar2;
      dVar4 = *(double *)((long)e + lVar3 * 4 + 8);
      dVar9 = dVar4 * b;
      dVar8 = dVar1 * dVar4 - (dVar1 * dVar4 - dVar4);
      dVar8 = (dVar4 - dVar8) * dVar7 -
              (((dVar9 - dVar8 * dVar6) - (dVar4 - dVar8) * dVar6) - dVar8 * dVar7);
      dVar10 = dVar5 + dVar8;
      dVar4 = dVar9 + dVar10;
      h[lVar3 + 1] = (dVar5 - (dVar10 - (dVar10 - dVar5))) + (dVar8 - (dVar10 - dVar5));
      (h + lVar3 + 1)[1] = (dVar9 - (dVar4 - (dVar4 - dVar9))) + (dVar10 - (dVar4 - dVar9));
      lVar2 = lVar3 + 2;
      dVar5 = dVar4;
    } while ((ulong)(uint)elen * 2 + -2 != lVar3 + 2);
    lVar3 = lVar3 + 3;
  }
  h[lVar3] = dVar4;
  return elen * 2;
}

Assistant:

int scale_expansion(int elen, REAL *e, REAL b, REAL *h)
/* e and h cannot be the same. */
{
  INEXACT REAL Q;
  INEXACT REAL sum;
  INEXACT REAL product1;
  REAL product0;
  int eindex, hindex;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;

  Split(b, bhi, blo);
  Two_Product_Presplit(e[0], b, bhi, blo, Q, h[0]);
  hindex = 1;
  for (eindex = 1; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Product_Presplit(enow, b, bhi, blo, product1, product0);
    Two_Sum(Q, product0, sum, h[hindex]);
    hindex++;
    Two_Sum(product1, sum, Q, h[hindex]);
    hindex++;
  }
  h[hindex] = Q;
  return elen + elen;
}